

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *
ellipses::detect_circle_approach
          (pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>
           *__return_storage_ptr__,Mat *pretreat,Mat *original,bool agregate_contour,bool debug)

{
  pointer pvVar1;
  undefined8 uVar2;
  Size SVar3;
  int iVar4;
  pointer pPVar5;
  pointer pPVar6;
  long lVar7;
  pointer pPVar8;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__range1;
  int iVar9;
  undefined7 in_register_00000081;
  int iVar10;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *pvVar11;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *r;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar19;
  undefined1 auVar18 [16];
  float fVar20;
  float fVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dis;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  _InputArray local_108;
  undefined1 local_e8 [32];
  double local_c8;
  int local_bc;
  Point2f local_b8;
  Size2f SStack_b0;
  Mat *local_a0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_98;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_78;
  Point2f local_58;
  Size2f SStack_50;
  int local_48;
  undefined8 local_38;
  
  local_bc = (int)CONCAT71(in_register_00000081,debug);
  if (local_bc != 0) {
    pvVar1 = (pointer)(local_e8 + 0x10);
    local_e8._0_8_ = pvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"gray","");
    cv::namedWindow((string *)local_e8,0);
    if ((pointer)local_e8._0_8_ != pvVar1) {
      operator_delete((void *)local_e8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_e8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    local_e8._0_8_ = pvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"gray","");
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_108.flags = 0x1010000;
    local_108.obj = pretreat;
    cv::imshow((string *)local_e8,&local_108);
    if ((pointer)local_e8._0_8_ != pvVar1) {
      operator_delete((void *)local_e8._0_8_,
                      (ulong)((long)&(((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                        *)local_e8._16_8_)->_M_impl).super__Vector_impl_data.
                                     _M_start + 1));
    }
    cv::waitKey(0);
  }
  local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_e8;
  local_e8._0_8_ = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x0;
  local_e8._8_8_ = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_108.sz.width = 0;
  local_108.sz.height = 0;
  local_108.flags = 0x1010000;
  local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8204000c;
  local_38 = 0;
  local_a0 = original;
  local_108.obj = pretreat;
  cv::findContours(&local_108,&local_78,1,2);
  uVar2 = local_e8._8_8_;
  local_108._0_16_ = ZEXT816(0);
  local_108.sz.width = 0;
  local_108.sz.height = 0;
  pvVar11 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_e8._0_8_;
  if (local_e8._0_8_ == local_e8._8_8_) {
    pPVar5 = (pointer)0x0;
  }
  else {
    do {
      if ((ulong)((long)local_108.obj - local_108._0_8_) <
          (ulong)((long)(pvVar11->
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar11->
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                       _M_impl.super__Vector_impl_data._M_start)) {
        std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_108,pvVar11)
        ;
      }
      pvVar11 = pvVar11 + 1;
    } while (pvVar11 != (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)uVar2);
    pPVar5 = (pointer)local_108._0_8_;
  }
  uVar2 = local_e8._8_8_;
  if (agregate_contour) {
    lVar7 = (long)local_108.obj - (long)pPVar5 >> 3;
    auVar22._8_4_ = (int)((long)local_108.obj - (long)pPVar5 >> 0x23);
    auVar22._0_8_ = lVar7;
    auVar22._12_4_ = 0x45300000;
    dVar12 = (auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    if ((pointer)local_108.obj == pPVar5) {
      fVar20 = 0.0;
      fVar23 = 0.0;
      dVar17 = 0.0;
    }
    else {
      auVar15._8_8_ = dVar12;
      auVar15._0_8_ = dVar12;
      dVar17 = 0.0;
      dVar19 = 0.0;
      pPVar8 = pPVar5;
      do {
        auVar21._0_8_ = (double)(*pPVar8).x;
        auVar21._8_8_ = (double)(*pPVar8).y;
        auVar22 = divpd(auVar21,auVar15);
        dVar17 = dVar17 + auVar22._0_8_;
        dVar19 = dVar19 + auVar22._8_8_;
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != (pointer)local_108.obj);
      fVar20 = (float)(int)dVar17;
      fVar23 = (float)(int)dVar19;
      dVar17 = 0.0;
      pPVar8 = pPVar5;
      do {
        iVar9 = (int)fVar20 - pPVar8->x;
        iVar10 = (int)fVar23 - pPVar8->y;
        dVar17 = dVar17 + SQRT((double)(iVar10 * iVar10 + iVar9 * iVar9));
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != (pointer)local_108.obj);
    }
    local_98.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_108.obj;
    if (local_e8._0_8_ != local_e8._8_8_) {
      dVar12 = (dVar17 / dVar12) * 2.5;
      local_b8.y = fVar23;
      local_b8.x = fVar20;
      SStack_b0.width = 0.0;
      SStack_b0.height = 0.0;
      pvVar11 = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_e8._0_8_;
      local_c8 = dVar12;
      do {
        pPVar5 = (pvVar11->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pPVar8 = (pvVar11->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        pPVar6 = (pointer)((long)pPVar8 - (long)pPVar5 >> 3);
        if ((pointer)0x6 < pPVar6) {
          if (pPVar5 == pPVar8) {
            iVar9 = 0;
            iVar10 = 0;
          }
          else {
            auVar13._8_4_ = (int)((long)pPVar8 - (long)pPVar5 >> 0x23);
            auVar13._0_8_ = pPVar6;
            auVar13._12_4_ = 0x45300000;
            dVar17 = (double)CONCAT44(0x43300000,(int)pPVar6) - 4503599627370496.0;
            dVar19 = auVar13._8_8_ - 1.9342813113834067e+25;
            auVar14._0_8_ = dVar19 + dVar17;
            auVar14._8_8_ = dVar19 + dVar17;
            dVar17 = 0.0;
            dVar19 = 0.0;
            do {
              auVar18._0_8_ = (double)(*pPVar5).x;
              auVar18._8_8_ = (double)(*pPVar5).y;
              auVar22 = divpd(auVar18,auVar14);
              dVar17 = dVar17 + auVar22._0_8_;
              dVar19 = dVar19 + auVar22._8_8_;
              pPVar5 = pPVar5 + 1;
            } while (pPVar5 != pPVar8);
            iVar9 = (int)dVar17;
            iVar10 = (int)dVar19;
            pPVar6 = pPVar5;
          }
          auVar16._0_4_ = -(uint)(fVar20 == (float)iVar9);
          auVar16._4_4_ = auVar16._0_4_;
          auVar16._8_4_ = -(uint)(fVar23 == (float)iVar10);
          auVar16._12_4_ = -(uint)(fVar23 == (float)iVar10);
          iVar4 = movmskpd((int)pPVar6,auVar16);
          if ((iVar4 != 3) &&
             (SQRT((double)(((int)fVar23 - iVar10) * ((int)fVar23 - iVar10) +
                           ((int)fVar20 - iVar9) * ((int)fVar20 - iVar9))) < dVar12)) {
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_108,
                       local_108.obj);
            dVar12 = local_c8;
            fVar20 = local_b8.x;
            fVar23 = local_b8.y;
          }
        }
        pvVar11 = pvVar11 + 1;
      } while (pvVar11 != (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)uVar2);
      pPVar5 = (pointer)local_108._0_8_;
      local_98.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_108.obj;
    }
    local_98.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_108.sz;
    local_108.flags = 0;
    local_108._4_4_ = 0;
    local_108.obj = (void *)0x0;
    local_108.sz.width = 0;
    local_108.sz.height = 0;
    local_98.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = pPVar5;
    cleanup_center_points(&local_78,&local_98,local_a0,local_bc._0_1_);
    SVar3 = local_108.sz;
    uVar2 = local_108._0_8_;
    local_108._4_4_ =
         local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_;
    local_108.flags =
         local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_;
    local_108.obj =
         local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_108.sz = (Size)local_78.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((void *)uVar2 != (void *)0x0) {
      operator_delete((void *)uVar2,(long)SVar3 - uVar2);
    }
    if (local_98.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pPVar5 = (pointer)local_108._0_8_;
  }
  if ((ulong)((long)local_108.obj - (long)pPVar5) < 0x29) {
    local_b8.x = 0.0;
    local_b8.y = 0.0;
    SStack_b0.width = 0.0;
    SStack_b0.height = 0.0;
    local_48 = 0;
  }
  else {
    local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x8103000c;
    local_78.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_108;
    cv::fitEllipse((_InputArray *)&local_58);
    local_b8 = local_58;
    SStack_b0 = SStack_50;
  }
  local_c8 = (double)CONCAT44(local_c8._4_4_,local_48);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            (&__return_storage_ptr__->first,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_108);
  (__return_storage_ptr__->second).center = local_b8;
  (__return_storage_ptr__->second).size = SStack_b0;
  (__return_storage_ptr__->second).angle = local_c8._0_4_;
  if ((void *)local_108._0_8_ != (void *)0x0) {
    operator_delete((void *)local_108._0_8_,(long)local_108.sz - local_108._0_8_);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::Point>, cv::RotatedRect> detect_circle_approach(
    const cv::Mat& pretreat, const cv::Mat& original, bool agregate_contour, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = v;
        }
    }

    if(agregate_contour)
    {
        auto top_center = center_of_mass(result);
        auto meand = mean_distance(top_center, result) * 2.5;

        for(auto& r : contours)
        {
            if(r.size() > 6)
            {
                auto local_center = center_of_mass(r);

                if(top_center != local_center && euclideanDistance(top_center, local_center) < meand)
                {
                    result.insert(result.end(), r.begin(), r.end());
                }
            }
        }

        result = cleanup_center_points(std::move(result), original, debug);
    }

    cv::RotatedRect rect;
    if(result.size() > 5)
        rect = cv::fitEllipse(result);

    return {result, rect};
}